

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kseq.hpp
# Opt level: O0

void __thiscall
kstream<gzFile_s_*,_FunctorZlib>::getQual(kstream<gzFile_s_*,_FunctorZlib> *this,kseq *seq)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  FILE *in_RSI;
  FILE *__stream;
  kstream<gzFile_s_*,_FunctorZlib> *in_RDI;
  bool bVar5;
  
  __stream = in_RSI;
  while( true ) {
    iVar2 = getc(in_RDI,__stream);
    in_RDI->c = iVar2;
    bVar5 = false;
    if (iVar2 != -1) {
      uVar3 = std::__cxx11::string::length();
      uVar4 = std::__cxx11::string::length();
      bVar5 = uVar3 < uVar4;
    }
    if (!bVar5) break;
    if ((0x20 < in_RDI->c) && (in_RDI->c < 0x80)) {
      cVar1 = (char)in_RDI->c;
      __stream = (FILE *)(ulong)(uint)(int)cVar1;
      std::__cxx11::string::operator+=((string *)&in_RSI->_markers,cVar1);
    }
  }
  return;
}

Assistant:

void getQual(kseq& seq){
        while ((c = this->getc()) != -1 && seq.qual.length() < seq.seq.length()) {
            if (c >= 33 && c <= 127)
                seq.qual += (char)c;
        }
    }